

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::detail::Static_Conversion_Impl<henson::BaseCoroutine,_henson::PythonPuppet>::
convert_down(Static_Conversion_Impl<henson::BaseCoroutine,_henson::PythonPuppet> *this,
            Boxed_Value *t_base)

{
  undefined8 uVar1;
  string *in_RDI;
  type_info *unaff_retaddr;
  Type_Info *in_stack_00000008;
  bad_boxed_dynamic_cast *in_stack_00000010;
  allocator local_39;
  string local_38 [48];
  
  uVar1 = __cxa_allocate_exception(0x48);
  Boxed_Value::get_type_info((Boxed_Value *)0x2e6c20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_38,"Unable to cast down inheritance hierarchy with non-polymorphic types",
             &local_39);
  chaiscript::exception::bad_boxed_dynamic_cast::bad_boxed_dynamic_cast
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,in_RDI);
  __cxa_throw(uVar1,&chaiscript::exception::bad_boxed_dynamic_cast::typeinfo,
              chaiscript::exception::bad_boxed_dynamic_cast::~bad_boxed_dynamic_cast);
}

Assistant:

virtual Boxed_Value convert_down(const Boxed_Value &t_base) const CHAISCRIPT_OVERRIDE
        {
          throw chaiscript::exception::bad_boxed_dynamic_cast(t_base.get_type_info(), typeid(Derived), "Unable to cast down inheritance hierarchy with non-polymorphic types");
        }